

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O1

bool __thiscall
wasm::Debug::LineState::update(LineState *this,LineTableOpcode *opcode,LineTable *table)

{
  LineNumberOps LVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ostream *poVar5;
  bool bVar6;
  undefined1 local_1a0 [16];
  long local_190;
  uint auStack_178 [88];
  
  LVar1 = opcode->Opcode;
  bVar6 = true;
  switch(LVar1) {
  case DW_LNS_extended_op:
    switch(opcode->SubOpcode) {
    case DW_LNE_end_sequence:
      goto switchD_00c8ff6a_caseD_1;
    case DW_LNE_set_address:
      this->addr = (uint32_t)opcode->Data;
      break;
    case DW_LNE_define_file:
      Fatal::Fatal((Fatal *)local_1a0);
      Fatal::operator<<((Fatal *)local_1a0,(char (*) [25])"TODO: DW_LNE_define_file");
      goto LAB_00c900fb;
    case DW_LNE_set_discriminator:
      this->discriminator = (uint32_t)opcode->Data;
      break;
    default:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"warning: unknown subopcode ",0x1b);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,opcode->SubOpcode);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," (this may be an unsupported version of DWARF)\n",0x2f);
    }
    break;
  case DW_LNS_copy:
    goto switchD_00c8ff6a_caseD_1;
  case DW_LNS_advance_pc:
    if (table->MinInstLength != '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "warning: bad MinInstLength (this may be an unsupported DWARF version)",0x45);
    }
  case DW_LNS_fixed_advance_pc:
    this->addr = this->addr + (int)opcode->Data;
    break;
  case DW_LNS_advance_line:
    this->line = this->line + (int)opcode->SData;
    break;
  case DW_LNS_set_file:
    this->file = (uint32_t)opcode->Data;
    break;
  case DW_LNS_set_column:
    this->col = (uint32_t)opcode->Data;
    break;
  case DW_LNS_negate_stmt:
    this->isStmt = (bool)(this->isStmt ^ 1);
    break;
  case DW_LNS_set_basic_block:
    this->basicBlock = true;
    break;
  case DW_LNS_const_add_pc:
    this->addr = this->addr +
                 (uint)table->MinInstLength * (uint)((byte)~table->OpcodeBase / table->LineRange);
    break;
  case DW_LNS_set_prologue_end:
    this->prologueEnd = true;
    break;
  default:
    bVar4 = LVar1 - table->OpcodeBase;
    if (table->OpcodeBase <= LVar1) {
      bVar2 = table->LineRange;
      bVar3 = table->MinInstLength;
      this->line = this->line + (int)table->LineBase + (uint)bVar4 % (uint)bVar2;
      this->addr = this->addr + ((uint)bVar4 / (uint)bVar2) * (uint)bVar3;
      return true;
    }
    Fatal::Fatal((Fatal *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190,"unknown debug line opcode: ",0x1b);
    *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) =
         *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) & 0xffffffb5 | 8;
    Fatal::operator<<((Fatal *)local_1a0,&opcode->Opcode);
LAB_00c900fb:
    Fatal::~Fatal((Fatal *)local_1a0);
  case DW_LNS_set_isa:
    this->isa = (uint32_t)opcode->Data;
  }
  bVar6 = false;
switchD_00c8ff6a_caseD_1:
  return bVar6;
}

Assistant:

bool update(llvm::DWARFYAML::LineTableOpcode& opcode,
              const llvm::DWARFYAML::LineTable& table) {
    switch (opcode.Opcode) {
      case 0: {
        // Extended opcodes
        switch (opcode.SubOpcode) {
          case llvm::dwarf::DW_LNE_set_address: {
            addr = opcode.Data;
            break;
          }
          case llvm::dwarf::DW_LNE_end_sequence: {
            return true;
          }
          case llvm::dwarf::DW_LNE_set_discriminator: {
            discriminator = opcode.Data;
            break;
          }
          case llvm::dwarf::DW_LNE_define_file: {
            Fatal() << "TODO: DW_LNE_define_file";
          }
          default: {
            // An unknown opcode, ignore.
            std::cerr << "warning: unknown subopcode " << opcode.SubOpcode
                      << " (this may be an unsupported version of DWARF)\n";
          }
        }
        break;
      }
      case llvm::dwarf::DW_LNS_set_column: {
        col = opcode.Data;
        break;
      }
      case llvm::dwarf::DW_LNS_set_prologue_end: {
        prologueEnd = true;
        break;
      }
      case llvm::dwarf::DW_LNS_copy: {
        return true;
      }
      case llvm::dwarf::DW_LNS_advance_pc: {
        if (table.MinInstLength != 1) {
          std::cerr << "warning: bad MinInstLength "
                       "(this may be an unsupported DWARF version)";
        }
        addr += opcode.Data;
        break;
      }
      case llvm::dwarf::DW_LNS_advance_line: {
        line += opcode.SData;
        break;
      }
      case llvm::dwarf::DW_LNS_set_file: {
        file = opcode.Data;
        break;
      }
      case llvm::dwarf::DW_LNS_negate_stmt: {
        isStmt = !isStmt;
        break;
      }
      case llvm::dwarf::DW_LNS_set_basic_block: {
        basicBlock = true;
        break;
      }
      case llvm::dwarf::DW_LNS_const_add_pc: {
        uint8_t AdjustOpcode = 255 - table.OpcodeBase;
        uint64_t AddrOffset =
          (AdjustOpcode / table.LineRange) * table.MinInstLength;
        addr += AddrOffset;
        break;
      }
      case llvm::dwarf::DW_LNS_fixed_advance_pc: {
        addr += opcode.Data;
        break;
      }
      case llvm::dwarf::DW_LNS_set_isa: {
        isa = opcode.Data;
        break;
      }
      default: {
        if (opcode.Opcode >= table.OpcodeBase) {
          // Special opcode: adjust line and addr, using some math.
          uint8_t AdjustOpcode =
            opcode.Opcode - table.OpcodeBase; // 20 - 13 = 7
          uint64_t AddrOffset = (AdjustOpcode / table.LineRange) *
                                table.MinInstLength; // (7 / 14) * 1 = 0
          int32_t LineOffset =
            table.LineBase +
            (AdjustOpcode % table.LineRange); // -5 + (7 % 14) = 2
          line += LineOffset;
          addr += AddrOffset;
          return true;
        } else {
          Fatal() << "unknown debug line opcode: " << std::hex << opcode.Opcode;
        }
      }
    }
    return false;
  }